

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::direct_indirect_indexed
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp *pMVar1;
  MicroOp local_21 [9];
  
  local_21[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_21);
    local_21[1] = 0x23;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_21 + 1);
      local_21[2] = 3;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_21 + 2);
        local_21[3] = 7;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_21 + 3);
          local_21[4] = 6;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_21 + 4);
            local_21[5] = 0x32;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_21 + 5);
              if (type == Read) {
                local_21[6] = 0x22;
                if ((target->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_003e978e;
                pMVar1 = local_21 + 6;
              }
              else {
                local_21[7] = 0x21;
                if ((target->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_003e978e;
                pMVar1 = local_21 + 7;
              }
              (*target->_M_invoker)((_Any_data *)target,pMVar1);
              local_21[8] = 8;
              if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*target->_M_invoker)((_Any_data *)target,local_21 + 8);
                read_write(type,is8bit,target);
                return;
              }
            }
          }
        }
      }
    }
  }
LAB_003e978e:
  std::__throw_bad_function_call();
}

Assistant:

static void direct_indirect_indexed(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// DO.

		target(OperationConstructDirect);
		target(CycleFetchPreviousPCThrowaway);			// IO.

		target(CycleFetchIncrementData);				// AAL.
		target(CycleFetchData);							// AAH.

		target(OperationCopyDataToInstruction);
		if(type == AccessType::Read) {
			target(OperationConstructAbsoluteYRead);	// Calculate data address, potentially skipping the next fetch.
		} else {
			target(OperationConstructAbsoluteY);		// Calculate data address.
		}
		target(CycleFetchIncorrectDataAddress);			// IO.

		read_write(type, is8bit, target);
	}